

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.cpp
# Opt level: O2

timestamp_t
duckdb::AddOperator::Operation<duckdb::date_t,duckdb::dtime_t,duckdb::timestamp_t>
          (date_t left,dtime_t right)

{
  bool bVar1;
  timestamp_t tVar2;
  OutOfRangeException *this;
  allocator local_41;
  timestamp_t local_40;
  string local_38;
  
  tVar2.value = 0x7fffffffffffffff;
  if (left.days != 0x7fffffff) {
    if (left.days == -0x7fffffff) {
      tVar2.value = -0x7fffffffffffffff;
    }
    else {
      bVar1 = Timestamp::TryFromDatetime(left,right,&local_40);
      tVar2.value = local_40.value;
      if (!bVar1) {
        this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&local_38,"Timestamp out of range",&local_41);
        OutOfRangeException::OutOfRangeException(this,&local_38);
        __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  return (timestamp_t)tVar2.value;
}

Assistant:

timestamp_t AddOperator::Operation(date_t left, dtime_t right) {
	if (left == date_t::infinity()) {
		return timestamp_t::infinity();
	} else if (left == date_t::ninfinity()) {
		return timestamp_t::ninfinity();
	}
	timestamp_t result;
	if (!Timestamp::TryFromDatetime(left, right, result)) {
		throw OutOfRangeException("Timestamp out of range");
	}
	return result;
}